

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufferedReader.cpp
# Opt level: O1

uint8_t * __thiscall
BufferedReader::readBlock
          (BufferedReader *this,int readerID,uint32_t *readCnt,int *rez,bool *firstBlockVar)

{
  int *piVar1;
  _Rb_tree_header *p_Var2;
  byte bVar3;
  uint32_t uVar4;
  int iVar5;
  _Base_ptr p_Var6;
  uint8_t *puVar7;
  uint32_t uVar8;
  _Base_ptr p_Var9;
  unique_lock<std::mutex> lk;
  int local_54;
  uint32_t *local_50;
  uint *local_48;
  unique_lock<std::mutex> local_40;
  
  local_54 = readerID;
  local_50 = readCnt;
  iVar5 = pthread_mutex_lock((pthread_mutex_t *)&this->m_readersMtx);
  if (iVar5 != 0) {
    std::__throw_system_error(iVar5);
  }
  p_Var2 = &(this->m_readers)._M_t._M_impl.super__Rb_tree_header;
  p_Var9 = (this->m_readers)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &p_Var2->_M_header;
  for (; p_Var9 != (_Base_ptr)0x0; p_Var9 = (&p_Var9->_M_left)[(int)p_Var9[1]._M_color < local_54])
  {
    if (local_54 <= (int)p_Var9[1]._M_color) {
      p_Var6 = p_Var9;
    }
  }
  p_Var9 = &p_Var2->_M_header;
  if (((_Rb_tree_header *)p_Var6 != p_Var2) && (p_Var9 = p_Var6, local_54 < (int)p_Var6[1]._M_color)
     ) {
    p_Var9 = &p_Var2->_M_header;
  }
  local_48 = (uint *)rez;
  if ((_Rb_tree_header *)p_Var9 == p_Var2) {
    *rez = 3;
    *local_50 = 0;
    p_Var6 = (_Base_ptr)rez;
  }
  else {
    p_Var6 = p_Var9[1]._M_parent;
    if ((*(int *)((long)&p_Var6->_M_parent + 4) == 0) &&
       (*(char *)((long)&p_Var6->_M_parent + 1) == '\0')) {
      *(undefined1 *)((long)&p_Var6->_M_parent + 1) = 1;
      piVar1 = (int *)((long)&p_Var6->_M_left + 4);
      *piVar1 = *piVar1 + 1;
      SafeQueueWithNotification<int>::push
                (&(this->m_readQueue).super_SafeQueueWithNotification<int>,&local_54);
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->m_readersMtx);
  if ((_Rb_tree_header *)p_Var9 == p_Var2) {
    puVar7 = (uint8_t *)0x0;
  }
  else {
    if (*(int *)((long)&p_Var6->_M_parent + 4) == 0) {
      local_40._M_device = &this->m_readMtx;
      local_40._M_owns = false;
      std::unique_lock<std::mutex>::lock(&local_40);
      local_40._M_owns = true;
      if (*(int *)((long)&p_Var6->_M_parent + 4) == 0) {
        do {
          if (*(char *)((long)&p_Var6->_M_left + 3) != '\0') break;
          std::condition_variable::wait((unique_lock *)&this->m_readCond);
        } while (*(int *)((long)&p_Var6->_M_parent + 4) == 0);
      }
      std::unique_lock<std::mutex>::~unique_lock(&local_40);
    }
    uVar4 = *(uint32_t *)((long)&p_Var6->_M_parent + 4);
    uVar8 = 0;
    if (0 < (int)uVar4) {
      uVar8 = uVar4;
    }
    *local_50 = uVar8;
    *local_48 = (uint)*(byte *)((long)&p_Var6->_M_left + 3);
    bVar3 = *(byte *)&p_Var6->_M_parent;
    *(byte *)&p_Var6->_M_parent = '\x01' - bVar3;
    *(undefined4 *)((long)&p_Var6->_M_parent + 4) = 0;
    *(undefined1 *)((long)&p_Var6->_M_parent + 1) = 0;
    if (firstBlockVar != (bool *)0x0) {
      *firstBlockVar = *(bool *)((long)&p_Var6->_M_left + 1);
    }
    puVar7 = *(uint8_t **)(&p_Var6[1]._M_color + (ulong)bVar3 * 2);
  }
  return puVar7;
}

Assistant:

uint8_t* BufferedReader::readBlock(const int readerID, uint32_t& readCnt, int& rez, bool* firstBlockVar)
{
    ReaderData* data;
    {
        std::lock_guard lock(m_readersMtx);
        const auto itr = m_readers.find(readerID);
        if (itr != m_readers.end())
        {
            data = itr->second;
            if (!data->m_nextBlockSize && !data->m_notified)
            {  // No fragments of this block found, and no requests for reading this block
                data->m_notified = true;
                data->m_atQueue++;
                m_readQueue.push(readerID);
            }
        }
        else
        {
            rez = UNKNOWN_READERID;
            readCnt = 0;
            return nullptr;
        }
    }

    if (!data->m_nextBlockSize)
    {
        std::unique_lock lk(m_readMtx);
        while (data->m_nextBlockSize == 0 && !data->m_eof) m_readCond.wait(lk);
    }
    readCnt = data->m_nextBlockSize >= 0 ? data->m_nextBlockSize : 0;
    rez = data->m_eof ? DATA_EOF : NO_ERROR;
    const uint8_t prevIndex = data->m_bufferIndex;
    data->m_bufferIndex = 1 - data->m_bufferIndex;
    data->m_nextBlockSize = 0;
    data->m_notified = false;
    if (firstBlockVar)
        *firstBlockVar = data->m_firstBlock;
    return data->m_nextBlock[prevIndex];
}